

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O2

_Bool remove_all_send_data_condition_function
                (void *item,void *match_context,_Bool *continue_processing)

{
  if (*(code **)((long)item + 0x10) != (code *)0x0) {
    (**(code **)((long)item + 0x10))(*(undefined8 *)((long)item + 0x18),*match_context);
  }
  free(item);
  *continue_processing = true;
  return true;
}

Assistant:

static bool remove_all_send_data_condition_function(const void* item, const void* match_context, bool* continue_processing)
{
    SEND_CALLBACK_DATA* send_data = (SEND_CALLBACK_DATA*)item;
    IOTHUB_MESSAGING_RESULT messagingResult = *(IOTHUB_MESSAGING_RESULT*)match_context;

    if (send_data->callback != NULL)
    {
        send_data->callback(send_data->userContext, messagingResult);
    }

    free(send_data);

    *continue_processing = true;
    return true;
}